

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O3

void av1_estimate_noise_level
               (YV12_BUFFER_CONFIG *frame,double *noise_level,int plane_from,int plane_to,
               int bit_depth,int edge_thresh)

{
  int width;
  int height;
  int stride;
  ulong uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  if (plane_from <= plane_to) {
    lVar3 = (long)plane_from;
    lVar2 = 0;
    do {
      uVar1 = (ulong)(-lVar2 != lVar3);
      width = *(int *)((long)frame->store_buf_adr + uVar1 * 4 + -0x38);
      height = *(int *)((long)frame->store_buf_adr + uVar1 * 4 + -0x30);
      stride = *(int *)((long)frame->store_buf_adr + uVar1 * 4 + -0x28);
      if ((frame->flags & 8) == 0) {
        dVar4 = (*av1_estimate_noise_from_single_plane)
                          (frame->store_buf_adr[lVar3 + lVar2 + -4],height,width,stride,edge_thresh)
        ;
      }
      else {
        dVar4 = av1_highbd_estimate_noise_from_single_plane_c
                          ((uint16_t *)((long)frame->store_buf_adr[lVar3 + lVar2 + -4] * 2),height,
                           width,stride,bit_depth,edge_thresh);
      }
      noise_level[lVar3 + lVar2] = dVar4;
      lVar2 = lVar2 + 1;
    } while ((plane_to - plane_from) + 1 != (int)lVar2);
  }
  return;
}

Assistant:

void av1_estimate_noise_level(const YV12_BUFFER_CONFIG *frame,
                              double *noise_level, int plane_from, int plane_to,
                              int bit_depth, int edge_thresh) {
  for (int plane = plane_from; plane <= plane_to; plane++) {
    const bool is_uv_plane = (plane != AOM_PLANE_Y);
    const int height = frame->crop_heights[is_uv_plane];
    const int width = frame->crop_widths[is_uv_plane];
    const int stride = frame->strides[is_uv_plane];
    const uint8_t *src = frame->buffers[plane];

#if CONFIG_AV1_HIGHBITDEPTH
    const uint16_t *src16 = CONVERT_TO_SHORTPTR(src);
    const int is_high_bitdepth = is_frame_high_bitdepth(frame);
    if (is_high_bitdepth) {
      noise_level[plane] = av1_highbd_estimate_noise_from_single_plane(
          src16, height, width, stride, bit_depth, edge_thresh);
    } else {
      noise_level[plane] = av1_estimate_noise_from_single_plane(
          src, height, width, stride, edge_thresh);
    }
#else
    (void)bit_depth;
    noise_level[plane] = av1_estimate_noise_from_single_plane(
        src, height, width, stride, edge_thresh);
#endif
  }
}